

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode
JsSetRuntimeDomWrapperTracingCallbacks
          (JsRuntimeHandle runtimeHandle,JsRef wrapperTracingState,
          JsDOMWrapperTracingCallback wrapperTracingCallback,
          JsDOMWrapperTracingDoneCallback wrapperTracingDoneCallback,
          JsDOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)

{
  ThreadContext *threadContext;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JsErrorCode JVar4;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_68 [2];
  TTDebuggerAbortException anon_var_0;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    threadContext = *runtimeHandle;
    ThreadContextScope::ThreadContextScope
              ((ThreadContextScope *)&anon_var_0.m_staticAbortMessage,threadContext);
    JVar4 = JsErrorWrongThread;
    if (anon_var_0.m_staticAbortMessage._1_1_ == '\x01') {
      JVar4 = JsNoError;
      Memory::Recycler::SetDOMWrapperTracingCallback
                (threadContext->recycler,wrapperTracingState,wrapperTracingCallback,
                 wrapperTracingDoneCallback,enterFinalPauseCallback);
    }
    ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&anon_var_0.m_staticAbortMessage);
  }
  if (0xfffffffd < JVar4 - JsErrorNotImplemented) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/../JsrtInternal.h"
                       ,0x89,
                       "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                       ,
                       "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  return JVar4;
}

Assistant:

CHAKRA_API
JsSetRuntimeDomWrapperTracingCallbacks(
    _In_ JsRuntimeHandle runtimeHandle,
    _In_ JsRef wrapperTracingState,
    _In_ JsDOMWrapperTracingCallback wrapperTracingCallback,
    _In_ JsDOMWrapperTracingDoneCallback wrapperTracingDoneCallback,
    _In_ JsDOMWrapperTracingEnterFinalPauseCallback enterFinalPauseCallback)
{
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        recycler->SetDOMWrapperTracingCallback(wrapperTracingState, reinterpret_cast<DOMWrapperTracingCallback>(wrapperTracingCallback), reinterpret_cast<DOMWrapperTracingDoneCallback>(wrapperTracingDoneCallback), reinterpret_cast<DOMWrapperTracingEnterFinalPauseCallback>(enterFinalPauseCallback));
        return JsNoError;
    });
}